

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O3

void __thiscall
TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test::
~TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test
          (TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMockPlugin_002cadc0;
  MockSupportPlugin::~MockSupportPlugin(&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin);
  StringBufferTestOutput::~StringBufferTestOutput
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).output);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x80);
  return;
}

Assistant:

TEST(MockPlugin, checkExpectationsAndClearAtEnd)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(test, expectations);

    mock().expectOneCall("foobar");

    plugin.postTestAction(*test, *result);

    STRCMP_CONTAINS(expectedFailure.getMessage().asCharString(), output.getOutput().asCharString());
    LONGS_EQUAL(0, mock().expectedCallsLeft());
    CHECK_NO_MOCK_FAILURE();
}